

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  int iVar1;
  mbedtls_mpi *B;
  mbedtls_mpi *X_00;
  mbedtls_mpi TU;
  mbedtls_mpi V1;
  mbedtls_mpi TV;
  mbedtls_mpi U2;
  mbedtls_mpi U1;
  mbedtls_mpi TA;
  mbedtls_mpi V2;
  mbedtls_mpi TB;
  mbedtls_mpi G;
  
  iVar1 = mbedtls_mpi_cmp_int(N,0);
  if (iVar1 < 1) {
    return -4;
  }
  TU.s = 1;
  TA.n = 0;
  TA.p = (mbedtls_mpi_uint *)0x0;
  TU.n = 0;
  TU.p = (mbedtls_mpi_uint *)0x0;
  U1.n = 0;
  U1.p = (mbedtls_mpi_uint *)0x0;
  U2.n = 0;
  U2.p = (mbedtls_mpi_uint *)0x0;
  G.n = 0;
  G.p = (mbedtls_mpi_uint *)0x0;
  TB.n = 0;
  TB.p = (mbedtls_mpi_uint *)0x0;
  TV.n = 0;
  TV.p = (mbedtls_mpi_uint *)0x0;
  V1.n = 0;
  V1.p = (mbedtls_mpi_uint *)0x0;
  V2.n = 0;
  V2.p = (mbedtls_mpi_uint *)0x0;
  V1.s = TU.s;
  TV.s = TU.s;
  U2.s = TU.s;
  U1.s = TU.s;
  TA.s = TU.s;
  V2.s = TU.s;
  TB.s = TU.s;
  G.s = TU.s;
  iVar1 = mbedtls_mpi_gcd(&G,A,N);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_int(&G,1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_mpi_mod_mpi(&TA,A,N);
      if (((((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&TU,&TA), iVar1 == 0)) &&
           (iVar1 = mbedtls_mpi_copy(&TB,N), iVar1 == 0)) &&
          ((iVar1 = mbedtls_mpi_copy(&TV,N), iVar1 == 0 &&
           (iVar1 = mbedtls_mpi_lset(&U1,1), iVar1 == 0)))) &&
         ((iVar1 = mbedtls_mpi_lset(&U2,0), iVar1 == 0 &&
          ((iVar1 = mbedtls_mpi_lset(&V1,0), iVar1 == 0 &&
           (iVar1 = mbedtls_mpi_lset(&V2,1), iVar1 == 0)))))) {
        do {
          while ((*TU.p & 1) == 0) {
            iVar1 = mbedtls_mpi_shift_r(&TU,1);
            if (((iVar1 != 0) ||
                ((((*U1.p & 1) != 0 || ((*U2.p & 1) != 0)) &&
                 ((iVar1 = mbedtls_mpi_add_mpi(&U1,&U1,&TB), iVar1 != 0 ||
                  (iVar1 = mbedtls_mpi_sub_mpi(&U2,&U2,&TA), iVar1 != 0)))))) ||
               ((iVar1 = mbedtls_mpi_shift_r(&U1,1), iVar1 != 0 ||
                (iVar1 = mbedtls_mpi_shift_r(&U2,1), iVar1 != 0)))) goto LAB_001184b1;
          }
          while ((*TV.p & 1) == 0) {
            iVar1 = mbedtls_mpi_shift_r(&TV,1);
            if ((iVar1 != 0) ||
               (((((*V1.p & 1) != 0 || ((*V2.p & 1) != 0)) &&
                 ((iVar1 = mbedtls_mpi_add_mpi(&V1,&V1,&TB), iVar1 != 0 ||
                  (iVar1 = mbedtls_mpi_sub_mpi(&V2,&V2,&TA), iVar1 != 0)))) ||
                ((iVar1 = mbedtls_mpi_shift_r(&V1,1), iVar1 != 0 ||
                 (iVar1 = mbedtls_mpi_shift_r(&V2,1), iVar1 != 0)))))) goto LAB_001184b1;
          }
          iVar1 = mbedtls_mpi_cmp_mpi(&TU,&TV);
          if (iVar1 < 0) {
            iVar1 = mbedtls_mpi_sub_mpi(&TV,&TV,&TU);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_sub_mpi(&V1,&V1,&U1), iVar1 != 0)) break;
            B = &U2;
            X_00 = &V2;
          }
          else {
            iVar1 = mbedtls_mpi_sub_mpi(&TU,&TU,&TV);
            if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_sub_mpi(&U1,&U1,&V1), iVar1 != 0)) break;
            B = &V2;
            X_00 = &U2;
          }
          iVar1 = mbedtls_mpi_sub_mpi(X_00,X_00,B);
          if (iVar1 != 0) break;
          iVar1 = mbedtls_mpi_cmp_int(&TU,0);
          if (iVar1 == 0) {
            goto LAB_001187ca;
          }
        } while( true );
      }
    }
    else {
      iVar1 = -0xe;
    }
  }
  goto LAB_001184b1;
  while (iVar1 = mbedtls_mpi_add_mpi(&V1,&V1,N), iVar1 == 0) {
LAB_001187ca:
    iVar1 = mbedtls_mpi_cmp_int(&V1,0);
    if (-1 < iVar1) {
      goto LAB_001187f6;
    }
  }
  goto LAB_001184b1;
  while (iVar1 = mbedtls_mpi_sub_mpi(&V1,&V1,N), iVar1 == 0) {
LAB_001187f6:
    iVar1 = mbedtls_mpi_cmp_mpi(&V1,N);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_copy(X,&V1);
      break;
    }
  }
LAB_001184b1:
  mbedtls_mpi_free(&TA);
  mbedtls_mpi_free(&TU);
  mbedtls_mpi_free(&U1);
  mbedtls_mpi_free(&U2);
  mbedtls_mpi_free(&G);
  mbedtls_mpi_free(&TB);
  mbedtls_mpi_free(&TV);
  mbedtls_mpi_free(&V1);
  mbedtls_mpi_free(&V2);
  return iVar1;
}

Assistant:

int mbedtls_mpi_inv_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TU ); mbedtls_mpi_init( &U1 ); mbedtls_mpi_init( &U2 );
    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &TB ); mbedtls_mpi_init( &TV );
    mbedtls_mpi_init( &V1 ); mbedtls_mpi_init( &V2 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, A, N ) );

    if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &TA, A, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TU, &TA ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TV, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U1, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U2, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V1, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V2, 1 ) );

    do
    {
        while( ( TU.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TU, 1 ) );

            if( ( U1.p[0] & 1 ) != 0 || ( U2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &U1, &U1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U2, 1 ) );
        }

        while( ( TV.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TV, 1 ) );

            if( ( V1.p[0] & 1 ) != 0 || ( V2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V2, 1 ) );
        }

        if( mbedtls_mpi_cmp_mpi( &TU, &TV ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TU, &TU, &TV ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U1, &U1, &V1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &V2 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TV, &TV, &TU ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, &U1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &U2 ) );
        }
    }
    while( mbedtls_mpi_cmp_int( &TU, 0 ) != 0 );

    while( mbedtls_mpi_cmp_int( &V1, 0 ) < 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, N ) );

    while( mbedtls_mpi_cmp_mpi( &V1, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &V1 ) );

cleanup:

    mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TU ); mbedtls_mpi_free( &U1 ); mbedtls_mpi_free( &U2 );
    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TV );
    mbedtls_mpi_free( &V1 ); mbedtls_mpi_free( &V2 );

    return( ret );
}